

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_data_skip(archive *_a)

{
  int iVar1;
  int magic_test;
  int64_t offset;
  size_t size;
  void *buff;
  archive *paStack_20;
  int r;
  archive_read *a;
  archive *_a_local;
  
  paStack_20 = _a;
  a = (archive_read *)_a;
  iVar1 = __archive_check_magic(_a,0xdeb0c5,4,"archive_read_data_skip");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    if (*(long *)(paStack_20[0xe].error_string.length + 0x30) == 0) {
      while (buff._4_4_ = archive_read_data_block
                                    (paStack_20,(void **)&size,(size_t *)&offset,
                                     (la_int64_t *)&stack0xffffffffffffffc0), buff._4_4_ == 0) {
        buff._4_4_ = 0;
      }
    }
    else {
      buff._4_4_ = (**(code **)(paStack_20[0xe].error_string.length + 0x30))(paStack_20);
    }
    if (buff._4_4_ == 1) {
      buff._4_4_ = 0;
    }
    paStack_20->state = 2;
    _a_local._4_4_ = buff._4_4_;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_data_skip(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r;
	const void *buff;
	size_t size;
	int64_t offset;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_read_data_skip");

	if (a->format->read_data_skip != NULL)
		r = (a->format->read_data_skip)(a);
	else {
		while ((r = archive_read_data_block(&a->archive,
			    &buff, &size, &offset))
		    == ARCHIVE_OK)
			;
	}

	if (r == ARCHIVE_EOF)
		r = ARCHIVE_OK;

	a->archive.state = ARCHIVE_STATE_HEADER;
	return (r);
}